

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  string *psVar2;
  ostream *this;
  cpp_generator_t gen;
  ofstream out;
  exception_t<cfgfile::string_trait_t> *x_1;
  tag_model_t tag;
  model_t model;
  ifstream in;
  HelpHasBeenPrintedException *anon_var_0;
  BaseException *x;
  for_generation_t data;
  model_t *in_stack_fffffffffffff658;
  tag_model_t *in_stack_fffffffffffff660;
  tag_model_t *in_stack_fffffffffffff680;
  model_t *in_stack_fffffffffffff6a0;
  undefined1 local_940 [96];
  model_t *in_stack_fffffffffffff720;
  tag_model_t *in_stack_fffffffffffff868;
  string_t *in_stack_fffffffffffff880;
  istream_t *in_stack_fffffffffffff888;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffff890;
  ostream *in_stack_fffffffffffff8a8;
  cpp_generator_t *in_stack_fffffffffffff8b0;
  char **in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa0c;
  undefined1 local_2c0 [532];
  undefined4 local_ac;
  for_generation_t local_50;
  int local_4;
  
  local_4 = 0;
  for_generation_t::for_generation_t((for_generation_t *)in_stack_fffffffffffff660);
  parse_cli(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00);
  for_generation_t::operator=
            ((for_generation_t *)in_stack_fffffffffffff660,
             (for_generation_t *)in_stack_fffffffffffff658);
  for_generation_t::~for_generation_t((for_generation_t *)in_stack_fffffffffffff660);
  psVar2 = for_generation_t::input_file_abi_cxx11_(&local_50);
  std::ifstream::ifstream(local_2c0,psVar2,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cout,"Specified input file doesn\'t exist.");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  cfgfile::generator::cfg::model_t::model_t((model_t *)in_stack_fffffffffffff660);
  cfgfile::generator::cfg::tag_model_t::tag_model_t(in_stack_fffffffffffff680);
  for_generation_t::input_file_abi_cxx11_(&local_50);
  cfgfile::read_cfgfile<cfgfile::string_trait_t>
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880);
  std::ifstream::close();
  cfgfile::generator::cfg::tag_model_t::cfg(in_stack_fffffffffffff868);
  cfgfile::generator::cfg::model_t::operator=
            ((model_t *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  cfgfile::generator::cfg::model_t::~model_t((model_t *)in_stack_fffffffffffff660);
  cfgfile::generator::cfg::model_t::prepare(in_stack_fffffffffffff720);
  cfgfile::generator::cfg::model_t::check(in_stack_fffffffffffff6a0);
  cfgfile::generator::cfg::tag_model_t::~tag_model_t(in_stack_fffffffffffff660);
  psVar2 = for_generation_t::output_file_abi_cxx11_(&local_50);
  std::ofstream::ofstream(local_940,psVar2,0x10);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    in_stack_fffffffffffff660 =
         (tag_model_t *)
         std::operator<<((ostream *)&std::cout,"Couldn\'t open output file for writting.");
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffff660,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_ac = 1;
  }
  else {
    cfgfile::generator::cpp_generator_t::cpp_generator_t
              ((cpp_generator_t *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
    cfgfile::generator::cpp_generator_t::generate
              (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    std::ofstream::close();
    local_4 = 0;
    local_ac = 1;
    cfgfile::generator::cpp_generator_t::~cpp_generator_t((cpp_generator_t *)0x13ad43);
  }
  std::ofstream::~ofstream(local_940);
  cfgfile::generator::cfg::model_t::~model_t((model_t *)in_stack_fffffffffffff660);
  std::ifstream::~ifstream(local_2c0);
  for_generation_t::~for_generation_t((for_generation_t *)in_stack_fffffffffffff660);
  return local_4;
}

Assistant:

int main( int argc, char ** argv )
{	
	for_generation_t data;

	try {
		data = parse_cli( argc, argv );
	}
	catch( const Args::HelpHasBeenPrintedException & )
	{
		return 0;
	}
	catch( const Args::BaseException & x )
	{
		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::ifstream in( data.input_file() );

	if( !in.good() )
	{
		std::cout << "Specified input file doesn't exist." << std::endl;

		exit( 1 );
	}

	cfgfile::generator::cfg::model_t model;

	try {
		cfgfile::generator::cfg::tag_model_t tag;

		cfgfile::read_cfgfile( tag, in, data.input_file() );

		in.close();

		model = tag.cfg();

		model.prepare();

		model.check();
	}
	catch( const cfgfile::exception_t< cfgfile::string_trait_t > & x )
	{
		in.close();

		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::ofstream out( data.output_file() );

	if( out.good() )
	{
		cfgfile::generator::cpp_generator_t gen( model );

		gen.generate( out );

		out.close();

		return 0;
	}
	else
	{
		std::cout << "Couldn't open output file for writting."
			<< std::endl;

		return 1;
	}
}